

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O2

void TTA::UpdateTable(uint u,uint v)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  puVar2 = next_;
  puVar1 = rtable_;
  if (u < v) {
    for (uVar5 = (ulong)v; uVar3 = u, uVar6 = v, (int)uVar5 != -1; uVar5 = (ulong)puVar2[uVar5]) {
      puVar1[uVar5] = u;
    }
  }
  else {
    uVar4 = u;
    if (u <= v) {
      return;
    }
    for (; uVar3 = v, uVar6 = u, uVar4 != 0xffffffff; uVar4 = puVar2[uVar4]) {
      puVar1[uVar4] = v;
    }
  }
  puVar1 = tail_;
  next_[tail_[uVar3]] = uVar6;
  puVar1[uVar3] = puVar1[uVar6];
  return;
}

Assistant:

static void UpdateTable(unsigned u, unsigned v)
    {
        if (u < v) {
            unsigned i = v;
            while (i != UINT_MAX) {
                rtable_[i] = u;
                i = next_[i];
            }
            next_[tail_[u]] = v;
            tail_[u] = tail_[v];
        }
        else if (u > v) {
            unsigned i = u;
            while (i != UINT_MAX) {
                rtable_[i] = v;
                i = next_[i];
            }
            next_[tail_[v]] = u;
            tail_[v] = tail_[u];
        }
    }